

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestComparisonsF<Counter<unsigned_long,64u>>(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  unsigned_long oldValue;
  long lVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  lVar1 = 0x3e9;
  iVar6 = -1;
  lVar2 = 1;
  bVar10 = false;
  uVar4 = 0;
  do {
    uVar5 = uVar4 + 1;
    lVar7 = 0;
    do {
      lVar8 = iVar6 + lVar7;
      lVar3 = lVar2 + lVar7;
      if (-1 < (lVar8 - lVar3 & lVar7 - lVar3)) {
        return bVar10;
      }
      if ((lVar3 - lVar8 | lVar7 - lVar8) < 0) {
        return bVar10;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 1000);
    lVar7 = (long)iVar6 + 1000;
    lVar8 = 1000;
    iVar9 = 2000;
    do {
      lVar3 = lVar1 + lVar8 + -1000;
      if (-1 < (lVar7 - lVar3 & lVar7 - lVar8 & lVar8 - lVar3)) {
        return bVar10;
      }
      if ((lVar3 - lVar7 | lVar8 - lVar7) < 0) {
        return bVar10;
      }
      lVar7 = lVar7 + -1;
      lVar8 = lVar8 + -1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    bVar10 = 1 < uVar4;
    lVar1 = lVar1 + 1;
    iVar6 = iVar6 + -1;
    lVar2 = lVar2 + 1;
    uVar4 = uVar5;
    if (uVar5 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}